

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O0

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  double dVar1;
  double i_00;
  long lVar2;
  long lVar3;
  long *plVar4;
  ulong size_00;
  ulong size_01;
  ulong size_02;
  LhsScalar *pLVar5;
  RhsScalar *pRVar6;
  LhsScalar *pLVar7;
  ulong *puVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  double *pdVar12;
  LhsScalar LStackY_2d8;
  size_t in_stack_fffffffffffffd30;
  ulong local_2a0;
  double *local_298;
  RhsScalar *local_288;
  RhsScalar *local_280;
  double *local_278;
  RhsScalar *local_268;
  RhsScalar *local_260;
  double *local_258;
  LhsScalar *local_250;
  LhsScalar *local_248;
  long local_240;
  long local_238;
  long actual_mc;
  long i2;
  long end;
  long start;
  long startTarget;
  long blockBOffset;
  long startBlock;
  long lengthTarget;
  long i3;
  double *l;
  double *r;
  double b;
  long j;
  double a;
  long s;
  long rs;
  long i;
  long k;
  long local_1a0;
  long local_198;
  long actualPanelWidth;
  long k1;
  long local_180;
  long actual_cols;
  long j2;
  long local_168;
  long actual_kc;
  long k2;
  long local_150;
  ulong local_148;
  long subcols;
  ptrdiff_t l2;
  ptrdiff_t l1;
  undefined1 local_128 [4];
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  conj_if<false> conj;
  aligned_stack_memory_handler<double> blockW_stack_memory_destructor;
  double *blockW;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *blockB;
  undefined1 local_d8 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeW;
  size_t sizeB;
  size_t sizeA;
  long local_98;
  long mc;
  long kc;
  blas_data_mapper<double,_long,_0> other;
  const_blas_data_mapper<double,_long,_0> tri;
  long cols;
  long otherStride_local;
  double *_other_local;
  long triStride_local;
  double *_tri_local;
  long otherSize_local;
  long size_local;
  ulong local_28;
  ulong local_20;
  
  pLVar7 = &LStackY_2d8;
  cols = otherStride;
  otherStride_local = (long)_other;
  _other_local = (double *)triStride;
  triStride_local = (long)_tri;
  _tri_local = (double *)otherSize;
  otherSize_local = size;
  const_blas_data_mapper<double,_long,_0>::const_blas_data_mapper
            ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,_tri,triStride);
  blas_data_mapper<double,_long,_0>::blas_data_mapper
            ((blas_data_mapper<double,_long,_0> *)&kc,(double *)otherStride_local,cols);
  mc = level3_blocking<double,_double>::kc(blocking);
  sizeA = level3_blocking<double,_double>::mc(blocking);
  plVar4 = std::min<long>(&otherSize_local,(long *)&sizeA);
  lVar9 = mc;
  local_98 = *plVar4;
  size_00 = mc * local_98;
  size_01 = mc * otherSize;
  size_02 = mc * 8;
  local_20 = size_00;
  if (0x1fffffffffffffff < size_00) {
    throw_std_bad_alloc();
  }
  pLVar5 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar5 == (LhsScalar *)0x0) {
    if (size_00 * 8 < 0x20001) {
      pLVar7 = (LhsScalar *)((long)&LStackY_2d8 - (size_00 * 8 + 0xf & 0xfffffffffffffff0));
      local_250 = pLVar7;
    }
    else {
      local_250 = (LhsScalar *)aligned_malloc(in_stack_fffffffffffffd30);
    }
    local_248 = local_250;
  }
  else {
    local_248 = level3_blocking<double,_double>::blockA(blocking);
    pLVar7 = &LStackY_2d8;
  }
  blockA_stack_memory_destructor._16_8_ = local_248;
  *(undefined8 *)((long)pLVar7 + -8) = 0x2dd1fe;
  pLVar5 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar5 == (LhsScalar *)0x0) {
    local_258 = (double *)blockA_stack_memory_destructor._16_8_;
  }
  else {
    local_258 = (double *)0x0;
  }
  *(undefined8 *)((long)pLVar7 + -8) = 0x2dd253;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d8,local_258,size_00,
             0x20000 < size_00 * 8);
  local_28 = size_01;
  if (0x1fffffffffffffff < size_01) {
    *(undefined8 *)((long)pLVar7 + -8) = 0x2dd273;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)pLVar7 + -8) = 0x2dd282;
  pRVar6 = level3_blocking<double,_double>::blockB(blocking);
  if (pRVar6 == (RhsScalar *)0x0) {
    if (size_01 * 8 < 0x20001) {
      pLVar7 = (LhsScalar *)((long)pLVar7 + -(size_01 * 8 + 0xf & 0xfffffffffffffff0));
      local_268 = pLVar7;
    }
    else {
      *(undefined8 *)((long)pLVar7 + -8) = 0x2dd2e2;
      local_268 = (RhsScalar *)aligned_malloc(*(size_t *)((long)pLVar7 + 8));
    }
    local_260 = local_268;
  }
  else {
    *(undefined8 *)((long)pLVar7 + -8) = 0x2dd291;
    local_260 = level3_blocking<double,_double>::blockB(blocking);
  }
  blockB_stack_memory_destructor._16_8_ = local_260;
  *(undefined8 *)((long)pLVar7 + -8) = 0x2dd320;
  pRVar6 = level3_blocking<double,_double>::blockB(blocking);
  if (pRVar6 == (RhsScalar *)0x0) {
    local_278 = (double *)blockB_stack_memory_destructor._16_8_;
  }
  else {
    local_278 = (double *)0x0;
  }
  *(undefined8 *)((long)pLVar7 + -8) = 0x2dd36e;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockW,local_278,size_01,0x20000 < size_01 * 8
            );
  size_local = size_02;
  if (0x1fffffffffffffff < size_02) {
    *(undefined8 *)((long)pLVar7 + -8) = 0x2dd390;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)pLVar7 + -8) = 0x2dd39f;
  pRVar6 = level3_blocking<double,_double>::blockW(blocking);
  if (pRVar6 == (RhsScalar *)0x0) {
    if ((ulong)(lVar9 << 6) < 0x20001) {
      pLVar7 = (LhsScalar *)((long)pLVar7 + lVar9 * -0x40);
      local_288 = pLVar7;
    }
    else {
      *(undefined8 *)((long)pLVar7 + -8) = 0x2dd3ff;
      local_288 = (RhsScalar *)aligned_malloc(*(size_t *)((long)pLVar7 + 8));
    }
    local_280 = local_288;
  }
  else {
    *(undefined8 *)((long)pLVar7 + -8) = 0x2dd3ae;
    local_280 = level3_blocking<double,_double>::blockW(blocking);
  }
  pLVar7[-1] = 1.48390294619883e-317;
  pRVar6 = level3_blocking<double,_double>::blockW(blocking);
  if (pRVar6 == (RhsScalar *)0x0) {
    local_298 = local_280;
  }
  else {
    local_298 = (double *)0x0;
  }
  pLVar7[-1] = 1.48394148331921e-317;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_128,local_298,size_02,
             0x20000 < (ulong)(lVar9 << 6));
  pLVar7[-1] = 1.48395284682906e-317;
  manage_caching_sizes(*(Action *)((long)pLVar7 + 0xc),(ptrdiff_t *)*pLVar7,(ptrdiff_t *)pLVar7[-1])
  ;
  if (otherSize < 1) {
    local_2a0 = 0;
  }
  else {
    pLVar7[-1] = 1.48397063319231e-317;
    plVar4 = std::max<long>(&cols,&otherSize_local);
    local_2a0 = (ulong)subcols / (ulong)(*plVar4 << 5);
  }
  local_148 = local_2a0;
  local_150 = (long)local_2a0 / 4 << 2;
  k2 = 4;
  pLVar7[-1] = 1.48402695667594e-317;
  puVar8 = (ulong *)std::max<long>(&local_150,&k2);
  local_148 = *puVar8;
  for (actual_kc = otherSize_local; 0 < actual_kc; actual_kc = actual_kc - mc) {
    j2 = actual_kc;
    pLVar7[-1] = 1.48406055313985e-317;
    plVar4 = std::min<long>(&j2,&mc);
    local_168 = *plVar4;
    for (actual_cols = 0; actual_cols < otherSize; actual_cols = local_148 + actual_cols) {
      k1 = otherSize - actual_cols;
      pLVar7[-1] = 1.48409760806329e-317;
      plVar4 = std::min<long>(&k1,(long *)&local_148);
      local_180 = *plVar4;
      for (actualPanelWidth = 0; actualPanelWidth < local_168;
          actualPanelWidth = actualPanelWidth + 4) {
        local_1a0 = local_168 - actualPanelWidth;
        k = 4;
        pLVar7[-1] = 1.48414306210271e-317;
        plVar4 = std::min<long>(&local_1a0,&k);
        local_198 = *plVar4;
        for (i = 0; lVar9 = actual_cols, i < local_198; i = i + 1) {
          lVar9 = ((actual_kc - actualPanelWidth) - i) + -1;
          s = (local_198 - i) + -1;
          a = (double)(lVar9 - s);
          rs = lVar9;
          pLVar7[-1] = 1.48421321942442e-317;
          pdVar10 = const_blas_data_mapper<double,_long,_0>::operator()
                              ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,lVar9,
                               lVar9);
          pLVar7[-1] = 1.48422063040911e-317;
          pdVar10 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pdVar10);
          j = (long)(1.0 / *pdVar10);
          for (b = (double)actual_cols; lVar11 = rs, lVar9 = j, dVar1 = b,
              (long)b < actual_cols + local_180; b = (double)((long)b + 1)) {
            pLVar7[-1] = 1.48427151917063e-317;
            pdVar10 = blas_data_mapper<double,_long,_0>::operator()
                                ((blas_data_mapper<double,_long,_0> *)&kc,lVar11,(long)dVar1);
            i_00 = a;
            dVar1 = b;
            r = (double *)((double)lVar9 * *pdVar10);
            *pdVar10 = (double)r;
            pLVar7[-1] = 1.48429474025598e-317;
            l = blas_data_mapper<double,_long,_0>::operator()
                          ((blas_data_mapper<double,_long,_0> *)&kc,(long)i_00,(long)dVar1);
            lVar9 = rs;
            dVar1 = a;
            pLVar7[-1] = 1.48430956222536e-317;
            i3 = (long)const_blas_data_mapper<double,_long,_0>::operator()
                                 ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,
                                  (long)dVar1,lVar9);
            for (lengthTarget = 0; pdVar10 = r, lengthTarget < s; lengthTarget = lengthTarget + 1) {
              pdVar12 = (double *)(i3 + lengthTarget * 8);
              pLVar7[-1] = 1.48435254593654e-317;
              pdVar12 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pdVar12);
              l[lengthTarget] = -(double)pdVar10 * *pdVar12 + l[lengthTarget];
            }
          }
        }
        startTarget = (local_168 - actualPanelWidth) - local_198;
        lVar11 = (actual_kc - actualPanelWidth) - local_198;
        blockBOffset = lVar11;
        startBlock = startTarget;
        pLVar7[-1] = 1.48452546891259e-317;
        blas_data_mapper<double,_long,_0>::operator()
                  ((blas_data_mapper<double,_long,_0> *)&kc,lVar11,lVar9);
        lVar9 = startTarget;
        pLVar7[-2] = (LhsScalar)local_168;
        pLVar7[-1] = (LhsScalar)lVar9;
        pLVar7[-3] = 1.48455857131086e-317;
        gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                  ((gemm_pack_rhs<double,_long,_4,_0,_false,_true> *)pLVar7[0xf],
                   (double *)pLVar7[0xe],(double *)pLVar7[0xd],(long)pLVar7[0xc],(long)pLVar7[0xb],
                   (long)pLVar7[10],(long)pLVar7[0x11],(long)pLVar7[0x12]);
        lVar9 = blockBOffset;
        if (0 < startBlock) {
          lVar11 = actual_kc - local_168;
          start = lVar11;
          pLVar7[-1] = 1.48459760249688e-317;
          const_blas_data_mapper<double,_long,_0>::operator()
                    ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,lVar11,lVar9);
          pLVar7[-1] = 0.0;
          pLVar7[-2] = 0.0;
          pLVar7[-3] = 1.48462823456692e-317;
          gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                    ((gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *)pLVar7[0x19],
                     (double *)pLVar7[0x18],(double *)pLVar7[0x17],(long)pLVar7[0x16],
                     (long)pLVar7[0x15],(long)pLVar7[0x14],(long)pLVar7[0x1b],(long)pLVar7[0x1c]);
          lVar11 = actual_cols;
          lVar9 = start;
          pLVar7[-1] = 1.48464256247065e-317;
          blas_data_mapper<double,_long,_0>::operator()
                    ((blas_data_mapper<double,_long,_0> *)&kc,lVar9,lVar11);
          lVar3 = local_168;
          lVar2 = local_180;
          lVar11 = local_198;
          lVar9 = startTarget;
          pLVar7[-2] = (LhsScalar)local_280;
          pLVar7[-3] = (LhsScalar)lVar9;
          pLVar7[-5] = (LhsScalar)lVar3;
          pLVar7[-6] = (LhsScalar)lVar11;
          pLVar7[-7] = (LhsScalar)lVar2;
          pLVar7[-8] = (LhsScalar)lVar11;
          pLVar7[-4] = 0.0;
          pLVar7[-9] = 1.48471123759543e-317;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)pLVar7[0xb5],
                     (ResScalar *)pLVar7[0xb4],(long)pLVar7[0xb3],(double *)pLVar7[0xb2],
                     (double *)pLVar7[0xb1],(long)pLVar7[0xb0],(long)pLVar7[0xb7],(long)pLVar7[0xb8]
                     ,pLVar7[0xaf],(long)pLVar7[0xb9],(long)pLVar7[0xba],(long)pLVar7[0xbb],
                     (long)pLVar7[0xbc],(double *)pLVar7[0xbd]);
        }
      }
    }
    end = 0;
    i2 = actual_kc - mc;
    for (actual_mc = 0; actual_mc < i2; actual_mc = local_98 + actual_mc) {
      local_240 = i2 - actual_mc;
      pLVar7[-1] = 1.48479374655828e-317;
      plVar4 = std::min<long>(&local_98,&local_240);
      lVar9 = actual_mc;
      local_238 = *plVar4;
      if (0 < *plVar4) {
        lVar11 = actual_kc - mc;
        pLVar7[-1] = 1.48482882521914e-317;
        const_blas_data_mapper<double,_long,_0>::operator()
                  ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,lVar9,lVar11);
        pLVar7[-1] = 0.0;
        pLVar7[-2] = 0.0;
        pLVar7[-3] = 1.48485945728918e-317;
        gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                  ((gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *)pLVar7[0x19],
                   (double *)pLVar7[0x18],(double *)pLVar7[0x17],(long)pLVar7[0x16],
                   (long)pLVar7[0x15],(long)pLVar7[0x14],(long)pLVar7[0x1b],(long)pLVar7[0x1c]);
        lVar9 = local_168;
        pLVar7[-2] = (LhsScalar)local_280;
        pLVar7[-7] = (LhsScalar)otherSize;
        pLVar7[-8] = (LhsScalar)lVar9;
        pLVar7[-3] = 0.0;
        pLVar7[-4] = 0.0;
        pLVar7[-5] = -NAN;
        pLVar7[-6] = -NAN;
        pLVar7[-9] = 1.48492566208572e-317;
        gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                  ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)pLVar7[0xb5],
                   (ResScalar *)pLVar7[0xb4],(long)pLVar7[0xb3],(double *)pLVar7[0xb2],
                   (double *)pLVar7[0xb1],(long)pLVar7[0xb0],(long)pLVar7[0xb7],(long)pLVar7[0xb8],
                   pLVar7[0xaf],(long)pLVar7[0xb9],(long)pLVar7[0xba],(long)pLVar7[0xbb],
                   (long)pLVar7[0xbc],(double *)pLVar7[0xbd]);
      }
    }
  }
  pLVar7[-1] = 1.48496469327174e-317;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)pLVar7[1]);
  pLVar7[-1] = 1.48497062205949e-317;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)pLVar7[1]);
  pLVar7[-1] = 1.48497655084724e-317;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)pLVar7[1]);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) *  std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }